

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkPreparing(XmlReporter *this,StringRef name)

{
  string *name_00;
  XmlWriter *pXVar1;
  long in_RDI;
  size_t in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  XmlFormatting fmt;
  undefined1 in_stack_ffffffffffffffa0 [16];
  XmlWriter *in_stack_ffffffffffffffb0;
  StringRef in_stack_ffffffffffffffb8;
  StringRef in_stack_ffffffffffffffc8;
  
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  name_00 = (string *)(in_RDI + 0x98);
  pXVar1 = (XmlWriter *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._8_8_,
             in_stack_ffffffffffffffa0._0_8_);
  operator|(Newline,Indent);
  pXVar1 = XmlWriter::startElement(pXVar1,name_00,fmt);
  operator____sr(&pXVar1->m_tagIsOpen,in_stack_ffffffffffffff68);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return;
}

Assistant:

void XmlReporter::benchmarkPreparing( StringRef name ) {
        m_xml.startElement("BenchmarkResults")
             .writeAttribute("name"_sr, name);
    }